

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel_list.c
# Opt level: O3

exr_result_t
exr_attr_chlist_add_with_length
          (exr_context_t ctxt,exr_attr_chlist_t *clist,char *name,int32_t namelen,
          exr_pixel_type_t ptype,exr_perceptual_treatment_t islinear,int32_t xsamp,int32_t ysamp)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  exr_attr_chlist_entry_t *peVar5;
  exr_attr_chlist_t *peVar6;
  exr_result_t eVar7;
  int iVar8;
  ulong uVar9;
  exr_attr_chlist_entry_t *peVar10;
  char **ppcVar11;
  char *pcVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  _func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr_varargs *UNRECOVERED_JUMPTABLE_00;
  long lVar16;
  exr_attr_chlist_entry_t nent;
  ulong local_80;
  exr_attr_string_t local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  exr_attr_chlist_entry_t *local_48;
  exr_attr_chlist_t *local_40;
  char **local_38;
  
  local_58 = 0;
  uStack_50 = 0;
  local_68.length = 0;
  local_68.alloc_size = 0;
  local_68.str = (char *)0x0;
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if (clist == (exr_attr_chlist_t *)0x0) {
    eVar7 = (*ctxt->report_error)(ctxt,3,"Invalid channel list pointer to chlist_add_with_length");
    return eVar7;
  }
  if (name == (char *)0x0) {
    name = "<NULL>";
  }
  else if ((namelen != 0) && (*name != '\0')) {
    if ((int)(uint)ctxt->max_name_length < namelen) {
      eVar7 = (*ctxt->print_error)
                        (ctxt,0xc,
                         "Channel name must shorter than length allowed by file (%d), received \'%s\' (%d)"
                         ,(ulong)ctxt->max_name_length,name,(ulong)(uint)namelen);
      return eVar7;
    }
    if (ptype < EXR_PIXEL_LAST_TYPE) {
      uVar9 = (ulong)islinear;
      if (islinear < 2) {
        if (xsamp < 1 || ysamp < 1) {
          eVar7 = (*ctxt->print_error)
                            (ctxt,3,
                             "Invalid pixel sampling (x %d y %d) adding channel \'%s\' to list",
                             (ulong)(uint)xsamp,(ulong)(uint)ysamp,name);
          return eVar7;
        }
        local_48 = clist->entries;
        uVar1 = clist->num_channels;
        local_40 = clist;
        if ((int)uVar1 < 1) {
          local_80 = 0;
        }
        else {
          ppcVar11 = &(local_48->name).str;
          uVar9 = 0;
          do {
            local_38 = ppcVar11;
            iVar8 = strcmp(name,*ppcVar11);
            local_80 = uVar9;
            if (iVar8 < 0) break;
            if (iVar8 == 0) {
              UNRECOVERED_JUMPTABLE_00 = ctxt->print_error;
              pcVar12 = "Attempt to add duplicate channel \'%s\' to channel list";
              goto LAB_00117351;
            }
            uVar9 = uVar9 + 1;
            ppcVar11 = local_38 + 4;
            local_80 = (ulong)uVar1;
          } while (uVar1 != uVar9);
        }
        eVar7 = exr_attr_string_create_with_length(ctxt,&local_68,name,namelen);
        peVar6 = local_40;
        if (eVar7 == 0) {
          iVar8 = local_40->num_channels;
          lVar16 = (long)iVar8;
          local_58._0_5_ = CONCAT14((char)islinear,ptype);
          uStack_50 = CONCAT44(ysamp,xsamp);
          if (iVar8 < local_40->num_alloced) {
            peVar10 = local_40->entries;
          }
          else {
            iVar15 = local_40->num_alloced * 2;
            iVar14 = iVar8 + 2;
            if (iVar8 < iVar15) {
              iVar14 = iVar15;
            }
            peVar10 = (exr_attr_chlist_entry_t *)(*ctxt->alloc_fn)((long)iVar14 << 5);
            if (peVar10 == (exr_attr_chlist_entry_t *)0x0) {
              exr_attr_string_destroy(ctxt,&local_68);
              eVar7 = (*ctxt->standard_error)(ctxt,1);
              return eVar7;
            }
            peVar6->num_alloced = iVar14;
          }
          iVar15 = (int)local_80;
          if (iVar15 < iVar8) {
            lVar13 = lVar16 << 5;
            do {
              uVar2 = *(undefined8 *)(local_48[-1].reserved + lVar13 + -0x15);
              uVar3 = *(undefined8 *)(local_48[-1].reserved + lVar13 + -0x15 + 8);
              uVar4 = *(undefined8 *)(local_48->reserved + lVar13 + -0x25 + 8);
              *(undefined8 *)(peVar10->reserved + lVar13 + -5) =
                   *(undefined8 *)(local_48->reserved + lVar13 + -0x25);
              *(undefined8 *)(peVar10->reserved + lVar13 + -5 + 8) = uVar4;
              *(undefined8 *)(peVar10->reserved + lVar13 + -0x15) = uVar2;
              *(undefined8 *)(peVar10->reserved + lVar13 + -0x15 + 8) = uVar3;
              lVar16 = lVar16 + -1;
              lVar13 = lVar13 + -0x20;
            } while (iVar15 < lVar16);
          }
          peVar5 = peVar10 + iVar15;
          peVar5->pixel_type = (undefined4)local_58;
          peVar5->p_linear = local_58._4_1_;
          peVar5->reserved[0] = local_58._5_1_;
          peVar5->reserved[1] = local_58._6_1_;
          peVar5->reserved[2] = local_58._7_1_;
          *(undefined8 *)(&peVar5->pixel_type + 2) = uStack_50;
          peVar5 = peVar10 + iVar15;
          (peVar5->name).length = local_68.length;
          (peVar5->name).alloc_size = local_68.alloc_size;
          (peVar5->name).str = local_68.str;
          if ((local_48 != (exr_attr_chlist_entry_t *)0x0) && (peVar10 != local_48)) {
            if (0 < iVar15) {
              lVar16 = 0;
              do {
                uVar2 = *(undefined8 *)(local_48->reserved + lVar16 + -0x15);
                uVar3 = *(undefined8 *)(local_48->reserved + lVar16 + -0x15 + 8);
                uVar4 = *(undefined8 *)(local_48->reserved + lVar16 + -5 + 8);
                *(undefined8 *)(peVar10->reserved + lVar16 + -5) =
                     *(undefined8 *)(local_48->reserved + lVar16 + -5);
                *(undefined8 *)(peVar10->reserved + lVar16 + -5 + 8) = uVar4;
                *(undefined8 *)(peVar10->reserved + lVar16 + -0x15) = uVar2;
                *(undefined8 *)(peVar10->reserved + lVar16 + -0x15 + 8) = uVar3;
                lVar16 = lVar16 + 0x20;
              } while ((local_80 & 0xffffffff) << 5 != lVar16);
            }
            (*ctxt->free_fn)(local_48);
          }
          peVar6->num_channels = iVar8 + 1;
          peVar6->entries = peVar10;
          eVar7 = 0;
        }
        return eVar7;
      }
      UNRECOVERED_JUMPTABLE_00 = ctxt->print_error;
      pcVar12 = "Invalid perceptual linear flag value (%d) adding channel \'%s\' to list";
    }
    else {
      UNRECOVERED_JUMPTABLE_00 = ctxt->print_error;
      pcVar12 = "Invalid pixel type specified (%d) adding channel \'%s\' to list";
      uVar9 = (ulong)ptype;
    }
    eVar7 = (*UNRECOVERED_JUMPTABLE_00)(ctxt,3,pcVar12,uVar9,name,UNRECOVERED_JUMPTABLE_00);
    return eVar7;
  }
  UNRECOVERED_JUMPTABLE_00 = ctxt->print_error;
  pcVar12 = "Channel name must not be empty, received \'%s\'";
LAB_00117351:
  eVar7 = (*UNRECOVERED_JUMPTABLE_00)(ctxt,3,pcVar12,name,UNRECOVERED_JUMPTABLE_00);
  return eVar7;
}

Assistant:

exr_result_t
exr_attr_chlist_add_with_length (
    exr_context_t              ctxt,
    exr_attr_chlist_t*         clist,
    const char*                name,
    int32_t                    namelen,
    exr_pixel_type_t           ptype,
    exr_perceptual_treatment_t islinear,
    int32_t                    xsamp,
    int32_t                    ysamp)
{
    exr_attr_chlist_entry_t  nent = {{0}};
    exr_attr_chlist_entry_t *nlist, *olist;
    int                      newcount, insertpos;
    int32_t                  maxlen;
    exr_result_t             rv;

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    maxlen = ctxt->max_name_length;

    if (!clist)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid channel list pointer to chlist_add_with_length");

    if (!name || name[0] == '\0' || namelen == 0)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Channel name must not be empty, received '%s'",
            (name ? name : "<NULL>"));

    if (namelen > maxlen)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_NAME_TOO_LONG,
            "Channel name must shorter than length allowed by file (%d), received '%s' (%d)",
            maxlen,
            name,
            namelen);

    if (ptype != EXR_PIXEL_UINT && ptype != EXR_PIXEL_HALF &&
        ptype != EXR_PIXEL_FLOAT)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid pixel type specified (%d) adding channel '%s' to list",
            (int) ptype,
            name);

    if (islinear != EXR_PERCEPTUALLY_LOGARITHMIC &&
        islinear != EXR_PERCEPTUALLY_LINEAR)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid perceptual linear flag value (%d) adding channel '%s' to list",
            (int) islinear,
            name);

    if (xsamp <= 0 || ysamp <= 0)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid pixel sampling (x %d y %d) adding channel '%s' to list",
            xsamp,
            ysamp,
            name);

    insertpos = 0;
    olist     = EXR_CONST_CAST (exr_attr_chlist_entry_t*, clist->entries);
    for (int32_t c = 0; c < clist->num_channels; ++c)
    {
        int ord = strcmp (name, olist[c].name.str);
        if (ord < 0)
        {
            insertpos = c;
            break;
        }
        else if (ord == 0)
        {
            return ctxt->print_error (
                ctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Attempt to add duplicate channel '%s' to channel list",
                name);
        }
        else
            insertpos = c + 1;
    }

    /* temporarily use newcount as a return value check */
    rv = exr_attr_string_create_with_length (ctxt, &(nent.name), name, namelen);
    if (rv != EXR_ERR_SUCCESS) return rv;

    newcount        = clist->num_channels + 1;
    nent.pixel_type = ptype;
    nent.p_linear   = (uint8_t) islinear;
    nent.x_sampling = xsamp;
    nent.y_sampling = ysamp;

    if (newcount > clist->num_alloced)
    {
        int nsz = clist->num_alloced * 2;
        if (newcount > nsz) nsz = newcount + 1;
        nlist = (exr_attr_chlist_entry_t*) ctxt->alloc_fn (
            sizeof (*nlist) * (size_t) nsz);
        if (nlist == NULL)
        {
            exr_attr_string_destroy (ctxt, &(nent.name));
            return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);
        }
        clist->num_alloced = nsz;
    }
    else
        nlist = EXR_CONST_CAST (exr_attr_chlist_entry_t*, clist->entries);

    /* since we can re-use same memory, have to have slightly more
     * complex logic to avoid overwrites, find where we will insert
     * and copy entries after that first */

    /* shift old entries further first */
    for (int i = newcount - 1; i > insertpos; --i)
        nlist[i] = olist[i - 1];
    nlist[insertpos] = nent;
    if (olist && nlist != olist)
    {
        for (int i = 0; i < insertpos; ++i)
            nlist[i] = olist[i];

        ctxt->free_fn (olist);
    }

    clist->num_channels = newcount;
    clist->entries      = nlist;

    return EXR_ERR_SUCCESS;
}